

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O0

void duckdb::HistogramBinUpdateFunction<duckdb::HistogramFunctor,bool,duckdb::HistogramExact>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  bool bVar1;
  unsafe_vector<bool> *bin_boundaries;
  TemplatedValidityMask<unsigned_long> *pTVar2;
  idx_t iVar3;
  ulong in_RCX;
  long in_RDI;
  UnifiedVectorFormat *in_R8;
  idx_t bin_entry;
  HistogramBinState<bool> *state;
  idx_t idx;
  idx_t i;
  bool *data;
  HistogramBinState<bool> **states;
  UnifiedVectorFormat input_data;
  bool extra_state;
  Vector *bin_vector;
  UnifiedVectorFormat sdata;
  Vector *input;
  Vector *in_stack_00000138;
  HistogramBinState<bool> *in_stack_00000140;
  UnifiedVectorFormat *in_stack_fffffffffffffec8;
  UnifiedVectorFormat *in_stack_fffffffffffffed0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  UnifiedVectorFormat *local_f8;
  SelectionVector *local_e0 [9];
  undefined1 local_91;
  undefined1 in_stack_ffffffffffffff7f;
  SelectionVector *local_78 [10];
  UnifiedVectorFormat *local_28;
  ulong local_20;
  long local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  duckdb::Vector::ToUnifiedFormat(local_20,local_28);
  bin_boundaries = (unsafe_vector<bool> *)(local_8 + 0x68);
  local_91 = HistogramFunctor::CreateExtraState((idx_t)local_28);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_e0);
  HistogramFunctor::PrepareData
            ((Vector *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (idx_t)in_stack_fffffffffffffed8,(bool *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  pTVar2 = (TemplatedValidityMask<unsigned_long> *)
           UnifiedVectorFormat::GetData<duckdb::HistogramBinState<bool>*>
                     ((UnifiedVectorFormat *)local_78);
  UnifiedVectorFormat::GetData<bool>((UnifiedVectorFormat *)local_e0);
  for (local_f8 = (UnifiedVectorFormat *)0x0; local_f8 < local_28; local_f8 = local_f8 + 1) {
    SelectionVector::get_index(local_e0[0],(idx_t)local_f8);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffed8,(idx_t)in_stack_fffffffffffffed0);
    if (bVar1) {
      in_stack_fffffffffffffed8 = pTVar2;
      iVar3 = SelectionVector::get_index(local_78[0],(idx_t)local_f8);
      bVar1 = HistogramBinState<bool>::IsSet
                        ((HistogramBinState<bool> *)
                         (&in_stack_fffffffffffffed8->validity_mask)[iVar3]);
      if (!bVar1) {
        HistogramBinState<bool>::InitializeBins<duckdb::HistogramFunctor>
                  (in_stack_00000140,in_stack_00000138,(idx_t)inputs,(idx_t)aggr_input,
                   (AggregateInputData *)input_count);
      }
      in_stack_fffffffffffffed0 =
           (UnifiedVectorFormat *)
           HistogramExact::GetBin<bool>((bool)in_stack_ffffffffffffff7f,bin_boundaries);
      in_stack_fffffffffffffec8 =
           (UnifiedVectorFormat *)
           vector<unsigned_long,_false>::operator[]
                     ((vector<unsigned_long,_false> *)in_stack_fffffffffffffed0,
                      (size_type)in_stack_fffffffffffffec8);
      *(value_type *)in_stack_fffffffffffffec8 = *(value_type *)in_stack_fffffffffffffec8 + 1;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffed0);
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffed0);
  return;
}

Assistant:

static void HistogramBinUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                       Vector &state_vector, idx_t count) {
	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto &bin_vector = inputs[1];

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);
	auto data = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.IsSet()) {
			state.template InitializeBins<OP>(bin_vector, count, i, aggr_input);
		}
		auto bin_entry = HIST::template GetBin<T>(data[idx], *state.bin_boundaries);
		++(*state.counts)[bin_entry];
	}
}